

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O2

void do_cmd_change_name(void)

{
  keycode_t kVar1;
  _Bool _Var2;
  ui_event_type uVar3;
  wchar_t mode;
  char *fmt;
  bool bVar4;
  ui_event uVar5;
  char fname [80];
  char namebuf [32];
  
  screen_save();
  bVar4 = true;
  mode = L'\0';
  do {
    if (!bVar4) {
      screen_load();
      return;
    }
    display_player(mode);
    Term_putstr(L'\x02',L'\x17',L'\xffffffff',L'\x01',
                "[\'c\' to change name, \'f\' to file, \'h\' to change mode, or ESC]");
    uVar5 = inkey_ex();
    bVar4 = true;
    uVar3 = uVar5.type;
    if (uVar3 == EVT_BUTTON) {
LAB_001d7dee:
      kVar1 = uVar5.key.code;
      switch(kVar1) {
      case 99:
        if (arg_force_name == true) {
          msg("You are not allowed to change your name!");
        }
        else {
          namebuf[0x10] = '\0';
          namebuf[0x11] = '\0';
          namebuf[0x12] = '\0';
          namebuf[0x13] = '\0';
          namebuf[0x14] = '\0';
          namebuf[0x15] = '\0';
          namebuf[0x16] = '\0';
          namebuf[0x17] = '\0';
          namebuf[0x18] = '\0';
          namebuf[0x19] = '\0';
          namebuf[0x1a] = '\0';
          namebuf[0x1b] = '\0';
          namebuf[0x1c] = '\0';
          namebuf[0x1d] = '\0';
          namebuf[0x1e] = '\0';
          namebuf[0x1f] = '\0';
          namebuf[0] = '\0';
          namebuf[1] = '\0';
          namebuf[2] = '\0';
          namebuf[3] = '\0';
          namebuf[4] = '\0';
          namebuf[5] = '\0';
          namebuf[6] = '\0';
          namebuf[7] = '\0';
          namebuf[8] = '\0';
          namebuf[9] = '\0';
          namebuf[10] = '\0';
          namebuf[0xb] = '\0';
          namebuf[0xc] = '\0';
          namebuf[0xd] = '\0';
          namebuf[0xe] = '\0';
          namebuf[0xf] = '\0';
          _Var2 = get_character_name(namebuf,0x20);
          if (_Var2) {
            my_strcpy(player->full_name,namebuf,0x20);
          }
        }
        break;
      case 100:
      case 0x65:
      case 0x67:
      case 0x69:
      case 0x6a:
      case 0x6b:
        break;
      case 0x66:
        player_safe_name(fname,0x50,player->full_name,false);
        my_strcat(fname,".txt",0x50);
        _Var2 = (*get_file)(fname,namebuf,0x400);
        if (_Var2) {
          _Var2 = dump_save(namebuf);
          fmt = "Character dump failed!";
          if (_Var2) {
            fmt = "Character dump successful.";
          }
          msg(fmt);
        }
        break;
      case 0x68:
switchD_001d7e39_caseD_68:
        mode = ~mode & 1;
        break;
      case 0x6c:
switchD_001d7e39_caseD_6c:
        mode = (mode + L'\xffffffff') % 2;
        break;
      default:
        if ((kVar1 == 0x20) || (kVar1 == 0x81)) goto switchD_001d7e39_caseD_68;
        if (kVar1 == 0x82) goto switchD_001d7e39_caseD_6c;
        if (kVar1 == 0xe000) goto LAB_001d7e76;
      }
    }
    else if (uVar3 == EVT_MOUSE) {
      if (uVar5.key.code._2_1_ != '\x02') {
        if (uVar5.key.code._2_1_ != '\x01') goto switchD_001d7e39_caseD_6c;
        goto switchD_001d7e39_caseD_68;
      }
LAB_001d7e76:
      bVar4 = false;
    }
    else if (uVar3 == EVT_KBRD) goto LAB_001d7dee;
    event_signal(EVENT_MESSAGE_FLUSH);
  } while( true );
}

Assistant:

void do_cmd_change_name(void)
{
	ui_event ke;
	int mode = 0;

	const char *p;

	bool more = true;

	/* Prompt */
	p = "['c' to change name, 'f' to file, 'h' to change mode, or ESC]";

	/* Save screen */
	screen_save();

	/* Forever */
	while (more) {
		/* Display the player */
		display_player(mode);

		/* Prompt */
		Term_putstr(2, 23, -1, COLOUR_WHITE, p);

		/* Query */
		ke = inkey_ex();

		if ((ke.type == EVT_KBRD)||(ke.type == EVT_BUTTON)) {
			switch (ke.key.code) {
				case ESCAPE: more = false; break;
				case 'c': {
					if(arg_force_name)
						msg("You are not allowed to change your name!");
					else {
					char namebuf[32] = "";

					/* Set player name */
					if (get_character_name(namebuf, sizeof namebuf))
						my_strcpy(player->full_name, namebuf,
								  sizeof(player->full_name));
					}

					break;
				}

				case 'f': {
					char buf[1024];
					char fname[80];

					/* Get the filesystem-safe name and append .txt */
					player_safe_name(fname, sizeof(fname), player->full_name, false);
					my_strcat(fname, ".txt", sizeof(fname));

					if (get_file(fname, buf, sizeof buf)) {
						if (dump_save(buf))
							msg("Character dump successful.");
						else
							msg("Character dump failed!");
					}
					break;
				}
				
				case 'h':
				case ARROW_LEFT:
				case ' ':
					mode = (mode + 1) % INFO_SCREENS;
					break;

				case 'l':
				case ARROW_RIGHT:
					mode = (mode - 1) % INFO_SCREENS;
					break;
			}
		} else if (ke.type == EVT_MOUSE) {
			if (ke.mouse.button == 1) {
				/* Flip through the screens */			
				mode = (mode + 1) % INFO_SCREENS;
			} else if (ke.mouse.button == 2) {
				/* exit the screen */
				more = false;
			} else {
				/* Flip backwards through the screens */			
				mode = (mode - 1) % INFO_SCREENS;
			}
		}

		/* Flush messages */
		event_signal(EVENT_MESSAGE_FLUSH);
	}

	/* Load screen */
	screen_load();
}